

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_maximum_likelihood_parameter_generation.cc
# Opt level: O2

void __thiscall
sptk::NonrecursiveMaximumLikelihoodParameterGeneration::
NonrecursiveMaximumLikelihoodParameterGeneration
          (NonrecursiveMaximumLikelihoodParameterGeneration *this,int num_order,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *window_coefficients,bool use_magic_number,double magic_number)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  const_iterator __position;
  int iVar1;
  pointer this_01;
  ulong uVar2;
  initializer_list<double> __l;
  allocator_type local_59;
  double local_58;
  _Vector_base<double,_std::allocator<double>_> local_50;
  double local_38;
  
  this->_vptr_NonrecursiveMaximumLikelihoodParameterGeneration =
       (_func_int **)&PTR__NonrecursiveMaximumLikelihoodParameterGeneration_0011ea30;
  this->num_order_ = num_order;
  this_00 = &this->window_coefficients_;
  local_58 = magic_number;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(this_00,window_coefficients);
  this->use_magic_number_ = use_magic_number;
  this->magic_number_ = local_58;
  this->is_valid_ = true;
  this->max_half_window_width_ = 0;
  if (num_order < 0) {
    this->is_valid_ = false;
  }
  else {
    __position._M_current =
         (this_00->
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_38 = 1.0;
    __l._M_len = 1;
    __l._M_array = &local_38;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_50,__l,&local_59);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_insert_rval(this_00,__position,(value_type *)&local_50);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
    for (this_01 = (this->window_coefficients_).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_01 !=
        (this->window_coefficients_).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
      uVar2 = (long)(this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      if (((uint)uVar2 >> 3 & 1) == 0) {
        local_50._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_01,(double *)&local_50);
      }
      uVar2 = uVar2 >> 3;
      iVar1 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 2);
      if (this->max_half_window_width_ < iVar1) {
        this->max_half_window_width_ = iVar1;
      }
    }
  }
  return;
}

Assistant:

NonrecursiveMaximumLikelihoodParameterGeneration::
    NonrecursiveMaximumLikelihoodParameterGeneration(
        int num_order,
        const std::vector<std::vector<double> >& window_coefficients,
        bool use_magic_number, double magic_number)
    : num_order_(num_order),
      window_coefficients_(window_coefficients),
      use_magic_number_(use_magic_number),
      magic_number_(magic_number),
      is_valid_(true),
      max_half_window_width_(0) {
  if (num_order < 0) {
    is_valid_ = false;
    return;
  }

  // Insert window coeffients for static components.
  window_coefficients_.insert(window_coefficients_.begin(), {1.0});

  for (std::vector<std::vector<double> >::iterator itr(
           window_coefficients_.begin());
       itr != window_coefficients_.end(); ++itr) {
    const int window_width(static_cast<int>(itr->size()));
    if (0 == window_width % 2) {
      itr->push_back(0.0);
    }
    const int half_window_width(window_width / 2);
    if (max_half_window_width_ < half_window_width) {
      max_half_window_width_ = half_window_width;
    }
  }
}